

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall GlobOpt::TryTailDup(GlobOpt *this,BranchInstr *tailBranch)

{
  IRKind IVar1;
  Type TVar2;
  BasicBlock *block;
  BasicBlock *block_00;
  byte bVar3;
  code *pcVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  BranchInstr *pBVar6;
  LabelInstr *oldLabelInstr;
  LabelInstr *pLVar7;
  Type *ppBVar8;
  Instr *instr;
  undefined4 *puVar9;
  LabelInstr *this_00;
  byte bVar10;
  undefined1 local_80 [8];
  EditingIterator iter;
  Type local_34;
  
  sourceContextId = Func::GetSourceContextId(((tailBranch->super_Instr).m_func)->topFunc);
  functionId = Func::GetLocalFunctionId(((tailBranch->super_Instr).m_func)->topFunc);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TailDupPhase,sourceContextId,functionId);
  if ((!bVar5) && (bVar5 = IR::BranchInstr::IsConditional(tailBranch), !bVar5)) {
    bVar10 = 1;
    pBVar6 = tailBranch;
    do {
      pBVar6 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pBVar6->super_Instr);
      IVar1 = (pBVar6->super_Instr).m_kind;
      if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) goto LAB_0041bc28;
      if (((pBVar6->super_Instr).field_0x38 & 0x10) != 0) goto LAB_0041bc1c;
      bVar5 = OpCodeAttr::CanCSE((pBVar6->super_Instr).m_opcode);
      bVar3 = bVar10 & bVar5;
      bVar10 = 0;
    } while (bVar3 != 0);
    IVar1 = (pBVar6->super_Instr).m_kind;
LAB_0041bc1c:
    if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
LAB_0041bc28:
      oldLabelInstr = IR::Instr::AsLabelInstr((Instr *)pBVar6);
      this_00 = oldLabelInstr;
      do {
        this_00 = (LabelInstr *)(this_00->super_Instr).m_prev;
        IVar1 = (this_00->super_Instr).m_kind;
        if ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) break;
        pLVar7 = IR::Instr::AsLabelInstr((Instr *)this_00);
      } while ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (pLVar7->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
               .super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar7->labelRefs);
      block = oldLabelInstr->m_block;
      TVar2 = (block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
              super_RealCount.count;
      local_80 = (undefined1  [8])&oldLabelInstr->labelRefs;
      iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
      local_34 = 0;
      iter.super_EditingIterator.super_Iterator.list =
           (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)local_80;
      iter.super_EditingIterator.last = (NodeBase *)local_80;
      while (bVar5 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::Next((EditingIterator *)local_80), bVar5) {
        ppBVar8 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)local_80);
        bVar5 = IR::BranchInstr::IsUnconditional(*ppBVar8);
        if (((bVar5) && (bVar5 = IR::BranchInstr::IsMultiBranch(*ppBVar8), !bVar5)) &&
           (pLVar7 = oldLabelInstr,
           (LabelInstr *)*ppBVar8 != (LabelInstr *)tailBranch && (LabelInstr *)*ppBVar8 != this_00))
        {
          while( true ) {
            pLVar7 = (LabelInstr *)(pLVar7->super_Instr).m_next;
            pBVar6 = *ppBVar8;
            if (pLVar7 == (LabelInstr *)tailBranch) break;
            instr = IR::Instr::Copy((Instr *)pLVar7,true);
            IR::Instr::InsertBefore(&pBVar6->super_Instr,instr);
          }
          IR::BranchInstr::ReplaceTarget(pBVar6,oldLabelInstr,tailBranch->m_branchTarget);
          for (; (IVar1 = (pBVar6->super_Instr).m_kind, IVar1 != InstrKindLabel &&
                 (IVar1 != InstrKindProfiledLabel));
              pBVar6 = (BranchInstr *)(pBVar6->super_Instr).m_prev) {
          }
          pLVar7 = IR::Instr::AsLabelInstr(&pBVar6->super_Instr);
          block_00 = pLVar7->m_block;
          BasicBlock::RemovePred(block,block_00,this->func->m_fg);
          FlowGraph::AddEdge(this->func->m_fg,block_00,tailBranch->m_branchTarget->m_block);
          local_34 = local_34 + 1;
        }
      }
      if (local_34 == TVar2) {
        if ((iter.super_EditingIterator.last)->next != iter.super_EditingIterator.last) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x342,"(mergeLabel->labelRefs.Empty())",
                             "Should not remove block with referenced label.");
          if (!bVar5) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar9 = 0;
        }
        FlowGraph::RemoveBlock(this->func->m_fg,block,(GlobOpt *)0x0,true);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::TryTailDup(IR::BranchInstr *tailBranch)
{
    if (PHASE_OFF(Js::TailDupPhase, tailBranch->m_func->GetTopFunc()))
    {
        return false;
    }

    if (tailBranch->IsConditional())
    {
        return false;
    }

    IR::Instr *instr;
    uint instrCount = 0;
    for (instr = tailBranch->GetPrevRealInstrOrLabel(); !instr->IsLabelInstr(); instr = instr->GetPrevRealInstrOrLabel())
    {
        if (instr->HasBailOutInfo())
        {
            break;
        }
        if (!OpCodeAttr::CanCSE(instr->m_opcode))
        {
            // Consider: We could be more aggressive here
            break;
        }

        instrCount++;

        if (instrCount > 1)
        {
            // Consider: If copy handled single-def tmps renaming, we could do more instrs
            break;
        }
    }

    if (!instr->IsLabelInstr())
    {
        return false;
    }

    IR::LabelInstr *mergeLabel = instr->AsLabelInstr();
    IR::Instr *mergeLabelPrev = mergeLabel->m_prev;

    // Skip unreferenced labels
    while (mergeLabelPrev->IsLabelInstr() && mergeLabelPrev->AsLabelInstr()->labelRefs.Empty())
    {
        mergeLabelPrev = mergeLabelPrev->m_prev;
    }

    BasicBlock* labelBlock = mergeLabel->GetBasicBlock();
    uint origPredCount = labelBlock->GetPredList()->Count();
    uint dupCount = 0;

    // We are good to go. Let's do the tail duplication.
    FOREACH_SLISTCOUNTED_ENTRY_EDITING(IR::BranchInstr*, branchEntry, &mergeLabel->labelRefs, iter)
    {
        if (branchEntry->IsUnconditional() && !branchEntry->IsMultiBranch() && branchEntry != mergeLabelPrev && branchEntry != tailBranch)
        {
            for (instr = mergeLabel->m_next; instr != tailBranch; instr = instr->m_next)
            {
                branchEntry->InsertBefore(instr->Copy());
            }

            instr = branchEntry;
            branchEntry->ReplaceTarget(mergeLabel, tailBranch->GetTarget());

            while(!instr->IsLabelInstr())
            {
                instr = instr->m_prev;
            }
            BasicBlock* branchBlock = instr->AsLabelInstr()->GetBasicBlock();

            labelBlock->RemovePred(branchBlock, func->m_fg);
            func->m_fg->AddEdge(branchBlock, tailBranch->GetTarget()->GetBasicBlock());

            dupCount++;
        }
    } NEXT_SLISTCOUNTED_ENTRY_EDITING;

    // If we've duplicated everywhere, tail block is dead and should be removed.
    if (dupCount == origPredCount)
    {
        AssertMsg(mergeLabel->labelRefs.Empty(), "Should not remove block with referenced label.");
        func->m_fg->RemoveBlock(labelBlock, nullptr, true);
    }

    return true;
}